

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O3

Abc_Cex_t *
Gia_ManCexMin(Gia_Man_t *p,Abc_Cex_t *pCex,int iFrameStart,int nRealPis,int fJustMax,int fUseAll,
             int fVerbose)

{
  bool bVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *__ptr;
  int iFrame;
  
  if (pCex->nPis != p->vCis->nSize - p->nRegs) {
    __assert_fail("pCex->nPis == Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexMin2.c"
                  ,0x142,
                  "Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)");
  }
  if (p->vCos->nSize - p->nRegs <= pCex->iPo) {
    __assert_fail("pCex->iPo < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexMin2.c"
                  ,0x144,
                  "Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)");
  }
  if ((iFrameStart < 0) || (pCex->iFrame < iFrameStart)) {
    __assert_fail("iFrameStart >= 0 && iFrameStart <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexMin2.c"
                  ,0x146,
                  "Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)");
  }
  if (pCex->nPis <= nRealPis) {
    __assert_fail("nRealPis < Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexMin2.c"
                  ,0x148,
                  "Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)");
  }
  Gia_ManAnnotateUnrolling(p,pCex,fJustMax);
  if (nRealPis < 0) {
    iFrame = pCex->iFrame;
    if (iFrameStart <= pCex->iFrame) {
      do {
        pGVar2 = Gia_ManCreateUnate(p,pCex,iFrame,-1,fUseAll);
        printf("%3d : ");
        Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
        if (fVerbose != 0) {
          Gia_AigerWrite(pGVar2,"temp.aig",0,0);
        }
        Gia_ManStop(pGVar2);
        bVar1 = iFrameStart < iFrame;
        iFrame = iFrame + -1;
      } while (bVar1);
    }
  }
  else {
    pGVar2 = Gia_ManCreateUnate(p,pCex,iFrameStart,nRealPis,fUseAll);
    printf("%3d : ");
    Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    if (fVerbose != 0) {
      Gia_AigerWrite(pGVar2,"temp.aig",0,0);
    }
    Gia_ManStop(pGVar2);
  }
  __ptr = p->vTruths;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      p->vTruths->pArray = (int *)0x0;
      __ptr = p->vTruths;
      if (__ptr == (Vec_Int_t *)0x0) goto LAB_005280ca;
    }
    free(__ptr);
    p->vTruths = (Vec_Int_t *)0x0;
  }
LAB_005280ca:
  p->nTtWords = 0;
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Gia_ManCexMin( Gia_Man_t * p, Abc_Cex_t * pCex, int iFrameStart, int nRealPis, int fJustMax, int fUseAll, int fVerbose )
{
    Gia_Man_t * pNew;
    int f, RetValue;
    // check CEX
    assert( pCex->nPis == Gia_ManPiNum(p) );
//    assert( pCex->nRegs == Gia_ManRegNum(p) );
    assert( pCex->iPo < Gia_ManPoNum(p) );
    // check frames
    assert( iFrameStart >= 0 && iFrameStart <= pCex->iFrame );
    // check primary inputs
    assert( nRealPis < Gia_ManPiNum(p) );
    // prepare
    RetValue = Gia_ManAnnotateUnrolling( p, pCex, fJustMax );
    if ( nRealPis >= 0 ) // refinement
    {
        pNew = Gia_ManCreateUnate( p, pCex, iFrameStart, nRealPis, fUseAll );
        printf( "%3d : ", iFrameStart );
        Gia_ManPrintStats( pNew, NULL );
        if ( fVerbose )
            Gia_AigerWrite( pNew, "temp.aig", 0, 0 );
        Gia_ManStop( pNew );
    }
    else // CEX min
    {
        for ( f = pCex->iFrame; f >= iFrameStart; f-- )
        {
            pNew = Gia_ManCreateUnate( p, pCex, f, -1, fUseAll );
            printf( "%3d : ", f );
            Gia_ManPrintStats( pNew, NULL );
            if ( fVerbose )
                Gia_AigerWrite( pNew, "temp.aig", 0, 0 );
            Gia_ManStop( pNew );
        }
    }
    Vec_IntFreeP( &p->vTruths );
    p->nTtWords = 0;
    return NULL;
}